

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

float Log::logf(float __x)

{
  char in_AL;
  char *in_RSI;
  int in_EDI;
  float extraout_XMM0_Da;
  va_list vl;
  __va_list_tag local_d8;
  undefined1 local_b8 [48];
  float local_88;
  
  if (in_AL != '\0') {
    local_88 = __x;
  }
  if (_Log::level <= in_EDI) {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &vl[0].overflow_arg_area;
    local_d8.gp_offset = 0x10;
    local_d8.fp_offset = 0x30;
    _Log::vlogf(in_EDI,in_RSI,(va_list *)&local_d8);
    __x = extraout_XMM0_Da;
  }
  return __x;
}

Assistant:

void Log::logf(int level, const char* format, ...)
{
  if(level < _Log::level)
    return;
  va_list vl;
  va_start(vl, format);
  _Log::vlogf(level, format, vl);
  va_end(vl);
}